

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_lib.cc
# Opt level: O0

void * X509V3_get_d2i(stack_st_X509_EXTENSION *x,int nid,int *crit,int *idx)

{
  int iVar1;
  size_t sVar2;
  X509_EXTENSION *pXVar3;
  bool bVar4;
  ulong local_50;
  size_t i;
  X509_EXTENSION *found_ex;
  X509_EXTENSION *ex;
  int lastpos;
  int *out_idx_local;
  int *out_critical_local;
  int nid_local;
  stack_st_X509_EXTENSION *extensions_local;
  
  i = 0;
  if (x == (stack_st_X509_EXTENSION *)0x0) {
    if (idx != (int *)0x0) {
      *idx = -1;
    }
    if (crit != (int *)0x0) {
      *crit = -1;
    }
    extensions_local = (stack_st_X509_EXTENSION *)0x0;
  }
  else {
    if (idx == (int *)0x0) {
      ex._4_4_ = 0;
    }
    else {
      ex._4_4_ = *idx + 1;
    }
    if (ex._4_4_ < 0) {
      ex._4_4_ = 0;
    }
    for (local_50 = (ulong)ex._4_4_; sVar2 = sk_X509_EXTENSION_num((stack_st_X509_EXTENSION *)x),
        local_50 < sVar2; local_50 = local_50 + 1) {
      pXVar3 = sk_X509_EXTENSION_value((stack_st_X509_EXTENSION *)x,local_50);
      iVar1 = OBJ_obj2nid((ASN1_OBJECT *)pXVar3->object);
      if (iVar1 == nid) {
        if (idx != (int *)0x0) {
          *idx = (int)local_50;
          i = (size_t)pXVar3;
          break;
        }
        bVar4 = i != 0;
        i = (size_t)pXVar3;
        if (bVar4) {
          if (crit != (int *)0x0) {
            *crit = -2;
          }
          return (void *)0x0;
        }
      }
    }
    if (i == 0) {
      if (idx != (int *)0x0) {
        *idx = -1;
      }
      if (crit != (int *)0x0) {
        *crit = -1;
      }
      extensions_local = (stack_st_X509_EXTENSION *)0x0;
    }
    else {
      if (crit != (int *)0x0) {
        iVar1 = X509_EXTENSION_get_critical((X509_EXTENSION *)i);
        *crit = iVar1;
      }
      extensions_local = (stack_st_X509_EXTENSION *)X509V3_EXT_d2i((X509_EXTENSION *)i);
    }
  }
  return extensions_local;
}

Assistant:

void *X509V3_get_d2i(const STACK_OF(X509_EXTENSION) *extensions, int nid,
                     int *out_critical, int *out_idx) {
  int lastpos;
  X509_EXTENSION *ex, *found_ex = NULL;
  if (!extensions) {
    if (out_idx) {
      *out_idx = -1;
    }
    if (out_critical) {
      *out_critical = -1;
    }
    return NULL;
  }
  if (out_idx) {
    lastpos = *out_idx + 1;
  } else {
    lastpos = 0;
  }
  if (lastpos < 0) {
    lastpos = 0;
  }
  for (size_t i = lastpos; i < sk_X509_EXTENSION_num(extensions); i++) {
    ex = sk_X509_EXTENSION_value(extensions, i);
    if (OBJ_obj2nid(ex->object) == nid) {
      if (out_idx) {
        // TODO(https://crbug.com/boringssl/379): Consistently reject
        // duplicate extensions.
        *out_idx = (int)i;
        found_ex = ex;
        break;
      } else if (found_ex) {
        // Found more than one
        if (out_critical) {
          *out_critical = -2;
        }
        return NULL;
      }
      found_ex = ex;
    }
  }
  if (found_ex) {
    // Found it
    if (out_critical) {
      *out_critical = X509_EXTENSION_get_critical(found_ex);
    }
    return X509V3_EXT_d2i(found_ex);
  }

  // Extension not found
  if (out_idx) {
    *out_idx = -1;
  }
  if (out_critical) {
    *out_critical = -1;
  }
  return NULL;
}